

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O1

Tag * __thiscall
Mustache::Renderer::findEndTag
          (Tag *__return_storage_ptr__,Renderer *this,QString *content,Tag *startTag,int endPos)

{
  QString *pQVar1;
  long lVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  bool bVar5;
  int iVar6;
  int pos;
  QStringView QVar7;
  QByteArrayView QVar8;
  QStringView QVar9;
  Tag nextTag;
  Tag local_b0;
  int local_7c;
  Tag *local_78;
  int *local_70;
  QString local_68;
  QArrayData *local_48;
  char16_t *pcStack_40;
  qsizetype local_38;
  
  pos = startTag->end;
  pQVar1 = &__return_storage_ptr__->key;
  local_70 = &__return_storage_ptr__->start;
  iVar6 = 1;
  local_7c = endPos;
  local_78 = startTag;
  do {
    findTag(&local_b0,this,content,pos,local_7c);
    if (local_b0.type == Null) {
      __return_storage_ptr__->type = Null;
      bVar5 = false;
      (__return_storage_ptr__->key).d.size = 0;
      (pQVar1->d).d = (Data *)0x0;
      (__return_storage_ptr__->key).d.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->key).d.d = local_b0.key.d.d;
      local_b0.key.d.d = (Data *)0x0;
      pcVar3 = (__return_storage_ptr__->key).d.ptr;
      (__return_storage_ptr__->key).d.ptr = local_b0.key.d.ptr;
      qVar4 = (__return_storage_ptr__->key).d.size;
      (__return_storage_ptr__->key).d.size = local_b0.key.d.size;
      *(ulong *)local_70 = CONCAT44(local_b0.end,local_b0.start);
      *(undefined8 *)(local_70 + 2) = local_b0._40_8_;
      local_b0.key.d.ptr = pcVar3;
      local_b0.key.d.size = qVar4;
    }
    else {
      if ((local_b0.type & ~Value) == SectionStart) {
        iVar6 = iVar6 + 1;
      }
      else if (local_b0.type == SectionEnd) {
        iVar6 = iVar6 + -1;
        if (iVar6 == 0) {
          lVar2 = (local_78->key).d.size;
          if (local_b0.key.d.size == lVar2) {
            QVar7.m_data = local_b0.key.d.ptr;
            QVar7.m_size = local_b0.key.d.size;
            QVar9.m_data = (local_78->key).d.ptr;
            QVar9.m_size = lVar2;
            iVar6 = QtPrivate::compareStrings(QVar7,QVar9,CaseSensitive);
            if (iVar6 != 0) goto LAB_00117d3b;
            __return_storage_ptr__->type = SectionEnd;
            (__return_storage_ptr__->key).d.size = 0;
            (pQVar1->d).d = (Data *)0x0;
            (__return_storage_ptr__->key).d.ptr = (char16_t *)0x0;
            (__return_storage_ptr__->key).d.d = local_b0.key.d.d;
            local_b0.key.d.d = (Data *)0x0;
            pcVar3 = (__return_storage_ptr__->key).d.ptr;
            (__return_storage_ptr__->key).d.ptr = local_b0.key.d.ptr;
            qVar4 = (__return_storage_ptr__->key).d.size;
            (__return_storage_ptr__->key).d.size = local_b0.key.d.size;
            *(ulong *)local_70 = CONCAT44(local_b0.end,local_b0.start);
            *(undefined8 *)(local_70 + 2) = local_b0._40_8_;
            local_b0.key.d.ptr = pcVar3;
            local_b0.key.d.size = qVar4;
          }
          else {
LAB_00117d3b:
            QVar8.m_data = (storage_type *)0x1a;
            QVar8.m_size = (qsizetype)&local_48;
            QString::fromUtf8(QVar8);
            local_68.d.d = (Data *)local_48;
            local_68.d.ptr = pcStack_40;
            local_68.d.size = local_38;
            setError(this,&local_68,local_b0.start);
            if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
              }
            }
            __return_storage_ptr__->type = Null;
            (__return_storage_ptr__->key).d.size = 0;
            __return_storage_ptr__->start = 0;
            __return_storage_ptr__->end = 0;
            (pQVar1->d).d = (Data *)0x0;
            (__return_storage_ptr__->key).d.ptr = (char16_t *)0x0;
            __return_storage_ptr__->escapeMode = Escape;
            __return_storage_ptr__->indentation = 0;
          }
          iVar6 = 0;
          bVar5 = false;
          goto LAB_00117cd7;
        }
      }
      bVar5 = true;
      pos = local_b0.end;
    }
LAB_00117cd7:
    if (&(local_b0.key.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b0.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b0.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b0.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b0.key.d.d)->super_QArrayData,2,8);
      }
    }
    if (!bVar5) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Tag Renderer::findEndTag(const QString& content, const Tag& startTag, int endPos)
{
	int tagDepth = 1;
	int pos = startTag.end;

	while (true) {
		Tag nextTag = findTag(content, pos, endPos);
		if (nextTag.type == Tag::Null) {
			return nextTag;
		} else if (nextTag.type == Tag::SectionStart || nextTag.type == Tag::InvertedSectionStart) {
			++tagDepth;
		} else if (nextTag.type == Tag::SectionEnd) {
			--tagDepth;
			if (tagDepth == 0) {
				if (nextTag.key != startTag.key) {
					setError("Tag start/end key mismatch", nextTag.start);
					return Tag();
				}
				return nextTag;
			}
		}
		pos = nextTag.end;
	}

	return Tag();
}